

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSupport.h
# Opt level: O3

void __thiscall TTD::MarkTable::Grow(MarkTable *this)

{
  uint uVar1;
  unsigned_long *obj;
  MarkTableTag *buffer;
  uint32 targetSize;
  int32 iVar2;
  HeapAllocator *pHVar3;
  uint64 *__s;
  MarkTableTag *__s_00;
  size_t count;
  size_t byteSize;
  ulong uVar4;
  undefined1 local_68 [8];
  TrackAllocData data;
  uint32 dummyPowerOf2;
  uint32 dummyNearPrime;
  
  count = (size_t)this->m_capcity;
  obj = this->m_addrArray;
  buffer = this->m_markArray;
  targetSize = this->m_capcity * 2;
  this->m_capcity = targetSize;
  data.line = 0;
  data._36_4_ = 0;
  LoadValuesForHashTables(targetSize,&data.line,(uint32 *)&data.field_0x24,&this->m_h2Prime);
  data.plusSize = (size_t)this->m_capcity;
  local_68 = (undefined1  [8])&unsigned_long::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_3fb7b9b;
  data.filename._0_4_ = 0x577;
  pHVar3 = Memory::HeapAllocator::TrackAllocInfo
                     (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_68);
  byteSize = (ulong)this->m_capcity << 3;
  __s = (uint64 *)Memory::HeapAllocator::AllocT<true>(pHVar3,byteSize);
  if (__s != (uint64 *)0x0) {
    memset(__s,0,byteSize);
    this->m_addrArray = __s;
    data.plusSize = (size_t)this->m_capcity;
    local_68 = (undefined1  [8])&MarkTableTag::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.count = (size_t)anon_var_dwarf_3fb7b9b;
    data.filename._0_4_ = 0x578;
    pHVar3 = Memory::HeapAllocator::TrackAllocInfo
                       (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_68);
    uVar1 = this->m_capcity;
    __s_00 = (MarkTableTag *)Memory::HeapAllocator::AllocT<true>(pHVar3,(ulong)uVar1);
    if (__s_00 != (MarkTableTag *)0x0) {
      memset(__s_00,0,(ulong)uVar1);
      this->m_markArray = __s_00;
      if (count == 0) {
        count = 0;
      }
      else {
        uVar4 = 0;
        do {
          iVar2 = FindIndexForKey(this,obj[uVar4]);
          this->m_addrArray[iVar2] = obj[uVar4];
          this->m_markArray[iVar2] = buffer[uVar4];
          uVar4 = uVar4 + 1;
        } while (count != uVar4);
      }
      Memory::DeleteArray<Memory::HeapAllocator,unsigned_long>
                (&Memory::HeapAllocator::Instance,count,obj);
      Memory::HeapAllocator::Free(&Memory::HeapAllocator::Instance,buffer,count);
      return;
    }
  }
  TTDAbort_unrecoverable_error("OOM in TTD");
}

Assistant:

void Grow()
        {
            uint32 oldCapacity = this->m_capcity;
            uint64* oldAddrArray = this->m_addrArray;
            MarkTableTag* oldMarkArray = this->m_markArray;

            this->m_capcity = this->m_capcity << 1; //double capacity

            uint32 dummyPowerOf2 = 0;
            uint32 dummyNearPrime = 0;
            LoadValuesForHashTables(this->m_capcity, &dummyPowerOf2, &dummyNearPrime, &(this->m_h2Prime));

            this->m_addrArray = TT_HEAP_ALLOC_ARRAY_ZERO(uint64, this->m_capcity);
            this->m_markArray = TT_HEAP_ALLOC_ARRAY_ZERO(MarkTableTag, this->m_capcity);

            for (uint32 i = 0; i < oldCapacity; ++i)
            {
                int32 idx = this->FindIndexForKey(oldAddrArray[i]);
                this->m_addrArray[idx] = oldAddrArray[i];
                this->m_markArray[idx] = oldMarkArray[i];
            }

            TT_HEAP_FREE_ARRAY(uint64, oldAddrArray, oldCapacity);
            TT_HEAP_FREE_ARRAY(MarkTableTag, oldMarkArray, oldCapacity);
        }